

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

int __thiscall phosg::toupper(phosg *this,int __c)

{
  bool bVar1;
  int iVar2;
  size_type __res;
  reference pcVar3;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  const_iterator cStack_48;
  char ch;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *s_local;
  string *ret;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(in_register_00000034,__c);
  ::std::__cxx11::string::string((string *)this);
  __res = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (this_00);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,__res);
  __end1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     (this_00);
  cStack_48 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                        (this_00);
  while (bVar1 = __gnu_cxx::
                 operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           (&__end1,&stack0xffffffffffffffb8), ((bVar1 ^ 0xffU) & 1) != 0) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    iVar2 = ::toupper((int)*pcVar3);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,(char)iVar2
              );
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return (int)this;
}

Assistant:

string toupper(const string& s) {
  string ret;
  ret.reserve(s.size());
  for (char ch : s) {
    ret.push_back(::toupper(ch));
  }
  return ret;
}